

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O2

void __thiscall fp::Algorithm::DFSAlgorithm(Algorithm *this,shared_ptr<fp::LandBasedRobot> *robot)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  _Elt_pointer paVar8;
  char *pcVar9;
  _Type aiVar10;
  array<int,_2UL> curr_node;
  array<int,_2UL> local_58;
  array<int,_2UL> *local_50;
  array<int,_2UL> *local_48;
  array<int,_2UL> *local_40;
  array<std::array<fp::Node,_16UL>,_16UL> *local_38;
  
  std::__shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>,
             &robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>);
  iVar2 = (**((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_LandBasedRobot)();
  iVar3 = (*((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_LandBasedRobot[0x15])();
  curr_node._M_elems[0] = iVar3;
  iVar4 = (*((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_LandBasedRobot[0x16])();
  curr_node._M_elems[1] = iVar4;
  local_38 = &this->node_master_;
  *&(this->node_master_)._M_elems[iVar3]._M_elems[iVar4].parent_node_._M_elems = curr_node._M_elems;
  SetDefaults(this);
  local_40 = &this->goal2_;
  local_48 = &this->goal3_;
  local_50 = &this->goal4_;
  do {
    Maze::ReadMaze(&this->maze_info,curr_node,(char)iVar2);
    FindNeighbours(this,curr_node,(char)iVar2);
    lVar7 = (long)curr_node._M_elems[1];
    lVar5 = (long)curr_node._M_elems[0];
    paVar8 = local_38->_M_elems[curr_node._M_elems[0]]._M_elems[lVar7].child_node_.c.
             super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur;
    if (paVar8 == local_38->_M_elems[curr_node._M_elems[0]]._M_elems[lVar7].child_node_.c.
                  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur) {
      aiVar10 = *&local_38->_M_elems[lVar5]._M_elems[lVar7].parent_node_._M_elems;
      pcVar9 = "Next is Parent Node: ";
      local_58._M_elems = aiVar10;
    }
    else {
      if (paVar8 == local_38->_M_elems[lVar5]._M_elems[lVar7].child_node_.c.
                    super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        paVar8 = local_38->_M_elems[lVar5]._M_elems[lVar7].child_node_.c.
                 super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      aiVar10 = *&paVar8[-1]._M_elems;
      local_58._M_elems = aiVar10;
      std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::pop_back
                (&local_38->_M_elems[curr_node._M_elems[0]]._M_elems[lVar7].child_node_.c);
      pcVar9 = "Child Node: ";
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,pcVar9);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,aiVar10[0]);
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,aiVar10[1]);
    std::endl<char,std::char_traits<char>>(poVar6);
    Navigate(this,&curr_node,&local_58);
    iVar2 = (**((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_LandBasedRobot)();
    curr_node._M_elems = aiVar10;
    bVar1 = std::operator==(&curr_node,&this->goal1_);
    if (bVar1) break;
    bVar1 = std::operator==(&curr_node,local_40);
    if (bVar1) break;
    bVar1 = std::operator==(&curr_node,local_48);
    if (bVar1) break;
    bVar1 = std::operator==(&curr_node,local_50);
  } while (!bVar1);
  SetDefaults(this);
  *&(this->end_goal_)._M_elems = curr_node._M_elems;
  API::setColor(curr_node._M_elems[1],0xf - curr_node._M_elems[0],'r');
  return;
}

Assistant:

void fp::Algorithm::DFSAlgorithm(const std::shared_ptr<fp::LandBasedRobot> &robot) {
    this->robot_ = robot;
    char curr_direction{robot->GetDirection()};
    std::array<int, 2> curr_node{robot->get_x_(), robot->get_y_()};
    std::array<int, 2> next_node{};
    this->node_master_[curr_node[0]][curr_node[1]].parent_node_ = curr_node;

    //---> Step 01: Clear all tile color <---//
    SetDefaults();
    while (true) {
        //---> Step 02: Read walls around the robot <---//
        this->maze_info.ReadMaze(curr_node, curr_direction);
        FindNeighbours(curr_node, curr_direction);
        if (!this->node_master_[curr_node[0]][curr_node[1]].child_node_.empty()) {
            next_node = this->node_master_[curr_node[0]][curr_node[1]].child_node_.top();
            this->node_master_[curr_node[0]][curr_node[1]].child_node_.pop();
            std::cerr << "Child Node: " << next_node[0] << ", " << next_node[1] << std::endl;
        } else {
            next_node = this->node_master_[curr_node[0]][curr_node[1]].parent_node_;
            std::cerr << "Next is Parent Node: " << next_node[0] << ", " << next_node[1] << std::endl;
        }
        this->Navigate(curr_node, next_node);


        //---> Step 06: Get robot current cell info <---//
        curr_direction = this->robot_->GetDirection();
        curr_node = next_node;

        //---> Step 07: Check for goal <---//
        if (curr_node == this->goal1_ || curr_node == this->goal2_ ||
            curr_node == this->goal3_ || curr_node == this->goal4_) {
            SetDefaults();
            this->end_goal_ = curr_node;
            fp::API::setColor(curr_node[1], 15 - curr_node[0], 'r');
            return;
        }
    }
    std::cerr << "\nNo path found!\n" << std::endl;
}